

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

QAMList * __thiscall
OSTEI_VRR_Algorithm_Base::GetAMReq
          (QAMList *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,QAM *am)

{
  bool bVar1;
  RRStepType rrstep;
  pointer __x;
  QAMList req;
  QAMList local_d8;
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  QAM::QAM((QAM *)local_90,am);
  rrstep = GetRRStep(this,(QAM *)local_90);
  std::__cxx11::string::~string((string *)(local_90 + 0x10));
  QAM::QAM((QAM *)local_c0,am);
  GenerateAMReq(&local_d8,(OSTEI_VRR_Algorithm_Base *)am,(QAM *)local_c0,rrstep,false);
  std::__cxx11::string::~string((string *)(local_c0 + 0x10));
  (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (__x = local_d8.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
             _M_start;
      __x != local_d8.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
             _M_finish; __x = __x + 1) {
    QAM::QAM((QAM *)local_60,__x);
    bVar1 = ValidQAM((QAM *)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 0x10));
    if (bVar1) {
      std::vector<QAM,_std::allocator<QAM>_>::push_back(__return_storage_ptr__,__x);
    }
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

QAMList OSTEI_VRR_Algorithm_Base::GetAMReq(QAM am) const
{
    RRStepType rrstep = GetRRStep(am);
    QAMList req = GenerateAMReq(am, rrstep);

    // remove invalid quartets
    QAMList req2;
    for(const auto & it : req)
    {
        if(ValidQAM(it))
            req2.push_back(it);
    }

    return req2;
}